

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_window_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::BaseSelectBinder::BindWindow
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,WindowExpression *window,
          idx_t depth)

{
  string *name_p;
  string *catalog;
  string *schema;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar1;
  vector<duckdb::OrderByNode,_true> *this_00;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  ExpressionType EVar2;
  bool bVar3;
  WindowBoundary WVar4;
  WindowExcludeMode WVar5;
  QueryErrorContext error_context_p;
  pointer puVar6;
  pointer pOVar7;
  ClientContext *pCVar8;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var9;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var10;
  FunctionData FVar11;
  size_type sVar12;
  WindowExpression *pWVar13;
  optional_idx oVar14;
  undefined8 uVar15;
  LogicalTypeId LVar16;
  OrderType OVar17;
  OrderByNullType OVar18;
  CatalogEntry *pCVar19;
  type pFVar20;
  BinderException *pBVar21;
  type pPVar22;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar23;
  pointer pEVar24;
  idx_t offset;
  pointer pBVar25;
  const_reference other;
  pointer pBVar26;
  DBConfig *this_01;
  reference pvVar27;
  LogicalType *other_00;
  InternalException *pIVar28;
  uint uVar29;
  ExpressionType type;
  ExpressionType type_00;
  ExpressionType type_01;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  shared_ptr<duckdb::ExtraValueInfo,_true> *this_02;
  pointer puVar30;
  pointer pOVar31;
  char *pcVar32;
  unsigned_long params_1;
  FunctionBinder local_5d0;
  WindowExpression *local_5c0;
  idx_t depth_local;
  optional_idx best_function;
  vector<duckdb::OrderByNode,_true> *__range1;
  OrderByNullType null_order;
  undefined7 uStack_58f;
  undefined4 local_588;
  undefined4 uStack_584;
  LogicalType end_type;
  undefined1 local_568 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_558;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_550;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_530;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_528;
  pointer local_520;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  LogicalType start_type;
  AggregateFunction bound_function;
  LogicalType sql_type;
  ErrorData error;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_258;
  string name;
  LogicalType local_218;
  EntryLookupInfo function_lookup;
  AggregateFunction local_1e0;
  ErrorData local_b0;
  
  error_context_p.query_location.index =
       (optional_idx)(window->super_ParsedExpression).super_BaseExpression.query_location.index;
  name_p = &window->function_name;
  depth_local = depth;
  EntryLookupInfo::EntryLookupInfo(&function_lookup,SCALAR_FUNCTION_ENTRY,name_p,error_context_p);
  catalog = &window->catalog;
  schema = &window->schema;
  local_5d0.context = (ClientContext *)this;
  entry = ExpressionBinder::GetCatalogEntry
                    (&this->super_ExpressionBinder,catalog,schema,&function_lookup,RETURN_NULL);
  local_5c0 = window;
  if ((entry.ptr != (CatalogEntry *)0x0 &&
       (window->super_ParsedExpression).super_BaseExpression.type == WINDOW_AGGREGATE) &&
     (pCVar19 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry), pWVar13 = local_5c0,
     pCVar19->type == MACRO_ENTRY)) {
    error.initialized = false;
    error.type = INVALID;
    error._2_6_ = 0;
    make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,decltype(nullptr),bool&>
              ((duckdb *)&bound_function,catalog,schema,name_p,&local_5c0->children,
               &local_5c0->filter_expr,(void **)&error,&local_5c0->distinct);
    (*(pWVar13->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              (&error,pWVar13);
    pFVar20 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                           *)&bound_function);
    pCVar19 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    (*((ExpressionBinder *)
      &(local_5d0.context)->super_enable_shared_from_this<duckdb::ClientContext>)->
      _vptr_ExpressionBinder[0xc])
              (__return_storage_ptr__,local_5d0.context,pFVar20,pCVar19,depth_local,&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        == (_func_int **)0x0) {
      return __return_storage_ptr__;
    }
    (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                  _vptr_Function + 8))();
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string
            ((string *)&name,
             (string *)&(local_5c0->super_ParsedExpression).super_BaseExpression.alias);
  if ((char)((local_5d0.context)->config).profiler_save_location._M_string_length == '\x01') {
    pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&bound_function,"window function calls cannot be nested",
               (allocator *)&error);
    BinderException::BinderException<>(pBVar21,error_context_p,(string *)&bound_function);
    __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (depth_local != 0) {
    pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&bound_function,"correlated columns in window functions not supported",
               (allocator *)&error);
    BinderException::BinderException<>(pBVar21,error_context_p,(string *)&bound_function);
    __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((byte)(local_5c0->start - EXPR_PRECEDING_RANGE) < 2) ||
     ((byte)(local_5c0->end - EXPR_PRECEDING_RANGE) < 2)) {
    local_588 = (int)CONCAT71((int7)((ulong)local_5c0 >> 8),1);
    if ((long)(local_5c0->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(local_5c0->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) {
      pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&bound_function,"RANGE frames must have only one ORDER BY expression",
                 (allocator *)&error);
      BinderException::BinderException<>(pBVar21,error_context_p,(string *)&bound_function);
      __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    _local_588 = (ulong)(uint)uStack_584 << 0x20;
  }
  *(undefined1 *)&((local_5d0.context)->config).profiler_save_location._M_string_length = 1;
  ErrorData::ErrorData(&error);
  puVar6 = (local_5c0->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar30 = (local_5c0->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6; puVar30 = puVar30 + 1
      ) {
    ExpressionBinder::BindChild((ExpressionBinder *)local_5d0.context,puVar30,depth_local,&error);
  }
  puVar6 = (local_5c0->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar30 = (local_5c0->partitions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6; puVar30 = puVar30 + 1
      ) {
    ExpressionBinder::BindChild((ExpressionBinder *)local_5d0.context,puVar30,depth_local,&error);
  }
  this_00 = &local_5c0->orders;
  pOVar7 = (local_5c0->orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar31 = (local_5c0->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pWVar13 = local_5c0,
      pCVar8 = local_5d0.context, pOVar31 != pOVar7; pOVar31 = pOVar31 + 1) {
    puVar1 = &pOVar31->expression;
    ExpressionBinder::BindChild((ExpressionBinder *)local_5d0.context,puVar1,depth_local,&error);
    if (((undefined1)local_588 != '\0') && (error.initialized == false)) {
      pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar1);
      puVar23 = BoundExpression::GetExpression(pPVar22);
      pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar23);
      LVar16 = (pEVar24->return_type).id_;
      if ((LVar16 == TIME_TZ) || (LVar16 == TIME)) {
        Value::DATE((Value *)&bound_function,(date_t)0x0);
        make_uniq<duckdb::ConstantExpression,duckdb::Value>
                  ((duckdb *)&types,(Value *)&bound_function);
        start_type._0_8_ =
             types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
        types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        Value::~Value((Value *)&bound_function);
        pCVar8 = local_5d0.context;
        ExpressionBinder::BindChild
                  ((ExpressionBinder *)local_5d0.context,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&start_type,depth_local,&error);
        pCVar8 = (ClientContext *)(pCVar8->config).home_directory._M_string_length;
        ::std::__cxx11::string::string((string *)&bound_function,"+",(allocator *)&types);
        BindRangeExpression(&local_218,pCVar8,(string *)&bound_function,puVar1,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&start_type);
        LogicalType::~LogicalType(&local_218);
        ::std::__cxx11::string::~string((string *)&bound_function);
        if (start_type._0_8_ != 0) {
          (**(code **)(*(long *)start_type._0_8_ + 8))();
        }
      }
    }
  }
  puVar1 = &local_5c0->filter_expr;
  ExpressionBinder::BindChild((ExpressionBinder *)local_5d0.context,puVar1,depth_local,&error);
  _local_588 = &pWVar13->start_expr;
  ExpressionBinder::BindChild
            ((ExpressionBinder *)pCVar8,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)_local_588,depth_local,&error);
  expr = &pWVar13->end_expr;
  ExpressionBinder::BindChild((ExpressionBinder *)pCVar8,expr,depth_local,&error);
  ExpressionBinder::BindChild((ExpressionBinder *)pCVar8,&pWVar13->offset_expr,depth_local,&error);
  ExpressionBinder::BindChild((ExpressionBinder *)pCVar8,&pWVar13->default_expr,depth_local,&error);
  pOVar7 = (pWVar13->arg_orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar31 = (pWVar13->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar31 != pOVar7; pOVar31 = pOVar31 + 1)
  {
    ExpressionBinder::BindChild
              ((ExpressionBinder *)local_5d0.context,&pOVar31->expression,depth_local,&error);
  }
  *(undefined1 *)&((local_5d0.context)->config).profiler_save_location._M_string_length = 0;
  if (error.initialized != false) {
    ErrorData::ErrorData(&local_b0,&error);
    BindResult::BindResult(__return_storage_ptr__,&local_b0);
    ErrorData::~ErrorData(&local_b0);
    goto LAB_01294394;
  }
  pOVar7 = (local_5c0->arg_orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar31 = (local_5c0->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar31 != pOVar7; pOVar31 = pOVar31 + 1)
  {
    pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pOVar31->expression);
    puVar23 = BoundExpression::GetExpression(pPVar22);
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar23);
    ExpressionBinder::PushCollation(pCVar8,puVar23,&pEVar24->return_type,ALL_COLLATIONS);
  }
  puVar6 = (local_5c0->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar30 = (local_5c0->partitions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6; puVar30 = puVar30 + 1
      ) {
    pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(puVar30);
    puVar23 = BoundExpression::GetExpression(pPVar22);
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar23);
    ExpressionBinder::PushCollation(pCVar8,puVar23,&pEVar24->return_type,ALL_COLLATIONS);
  }
  pOVar7 = (local_5c0->orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar31 = (local_5c0->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar31 != pOVar7; pOVar31 = pOVar31 + 1)
  {
    pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pOVar31->expression);
    puVar23 = BoundExpression::GetExpression(pPVar22);
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar23);
    ExpressionBinder::PushCollation(pCVar8,puVar23,&pEVar24->return_type,ALL_COLLATIONS);
  }
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar6 = (local_5c0->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar30 = (local_5c0->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6; puVar30 = puVar30 + 1
      ) {
    pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(puVar30);
    puVar23 = BoundExpression::GetExpression(pPVar22);
    EVar2 = (local_5c0->super_ParsedExpression).super_BaseExpression.type;
    if (EVar2 == WINDOW_NTILE) {
      if (children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
        local_550._M_head_impl =
             (puVar23->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalType::LogicalType((LogicalType *)&bound_function,BIGINT);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)&start_type,pCVar8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_550,(LogicalType *)&bound_function,false);
        uVar15 = start_type._0_8_;
        start_type.id_ = INVALID;
        start_type.physical_type_ = ~INVALID;
        start_type._2_6_ = 0;
        _Var9._M_head_impl =
             (puVar23->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar15;
        if (_Var9._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
        }
        if (start_type._0_8_ != 0) {
          (**(code **)(*(long *)start_type._0_8_ + 8))();
        }
        start_type.id_ = INVALID;
        start_type.physical_type_ = ~INVALID;
        start_type._2_6_ = 0;
        LogicalType::~LogicalType((LogicalType *)&bound_function);
        if (local_550._M_head_impl != (Expression *)0x0) {
          (*((local_550._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_550._M_head_impl = (Expression *)0x0;
      }
    }
    else if ((EVar2 == WINDOW_NTH_VALUE) &&
            ((long)children.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)children.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 8)) {
      pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
      local_558._M_head_impl =
           (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      LogicalType::LogicalType((LogicalType *)&bound_function,BIGINT);
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)&start_type,pCVar8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_558,(LogicalType *)&bound_function,false);
      uVar15 = start_type._0_8_;
      start_type.id_ = INVALID;
      start_type.physical_type_ = ~INVALID;
      start_type._2_6_ = 0;
      _Var9._M_head_impl =
           (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar15;
      if (_Var9._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
      }
      if (start_type._0_8_ != 0) {
        (**(code **)(*(long *)start_type._0_8_ + 8))();
      }
      start_type.id_ = INVALID;
      start_type.physical_type_ = ~INVALID;
      start_type._2_6_ = 0;
      LogicalType::~LogicalType((LogicalType *)&bound_function);
      if (local_558._M_head_impl != (Expression *)0x0) {
        (*((local_558._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_558._M_head_impl = (Expression *)0x0;
    }
    pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar23);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &pEVar24->return_type);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&children,puVar23);
  }
  LogicalType::LogicalType(&sql_type);
  local_568._8_8_ = (long *)0x0;
  local_568._0_8_ = (FunctionData *)0x0;
  EVar2 = (local_5c0->super_ParsedExpression).super_BaseExpression.type;
  if (EVar2 == 0x6e) {
    if ((entry.ptr == (CatalogEntry *)0x0) ||
       (pCVar19 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry),
       pCVar19->type != AGGREGATE_FUNCTION_ENTRY)) {
      Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                ((ClientContext *)((local_5d0.context)->config).home_directory._M_string_length,
                 catalog,schema,name_p,error_context_p);
    }
    pCVar19 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    ErrorData::ErrorData((ErrorData *)&start_type);
    FunctionBinder::FunctionBinder
              ((FunctionBinder *)&end_type,
               (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length);
    this_02 = &pCVar19[1].comment.value_info_;
    best_function =
         FunctionBinder::BindFunction
                   ((FunctionBinder *)&end_type,&pCVar19->name,(AggregateFunctionSet *)this_02,
                    &types,(ErrorData *)&start_type);
    if (best_function.index == 0xffffffffffffffff) {
      ErrorData::AddQueryLocation((ErrorData *)&start_type,&local_5c0->super_ParsedExpression);
      ::std::__cxx11::string::string
                ((string *)&bound_function,anon_var_dwarf_3b6586a + 9,(allocator *)&local_5d0);
      ErrorData::Throw((ErrorData *)&start_type,(string *)&bound_function);
    }
    offset = optional_idx::GetIndex(&best_function);
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
              (&bound_function,(FunctionSet<duckdb::AggregateFunction> *)this_02,offset);
    AggregateFunction::AggregateFunction(&local_1e0,&bound_function);
    local_258.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         children.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_258.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         children.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_258.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         children.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_520 = (pointer)0x0;
    FunctionBinder::BindAggregateFunction
              (&local_5d0,(AggregateFunction *)&end_type,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_1e0,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_258,(AggregateType)&local_520);
    if (local_520 != (pointer)0x0) {
      (**(code **)(*(long *)local_520 + 8))();
    }
    local_520 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_258);
    AggregateFunction::~AggregateFunction(&local_1e0);
    pBVar25 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_5d0);
    make_uniq<duckdb::AggregateFunction,duckdb::AggregateFunction&>
              ((duckdb *)&null_order,&pBVar25->function);
    uVar15 = local_568._8_8_;
    local_568._8_8_ = _null_order;
    _null_order = (long *)0x0;
    if (((long *)uVar15 != (long *)0x0) &&
       ((**(code **)(*(long *)uVar15 + 8))(), (long *)_null_order != (long *)0x0)) {
      (**(code **)(*(long *)_null_order + 8))();
    }
    pBVar25 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_5d0);
    _Var10._M_head_impl =
         (pBVar25->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (pBVar25->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
    if ((FunctionData *)local_568._0_8_ != (FunctionData *)0x0) {
      FVar11._vptr_FunctionData = *(_func_int ***)local_568._0_8_;
      local_568._0_8_ = _Var10._M_head_impl;
      (*FVar11._vptr_FunctionData[1])();
      _Var10._M_head_impl = (FunctionData *)local_568._0_8_;
    }
    local_568._0_8_ = _Var10._M_head_impl;
    pBVar25 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_5d0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_move_assign(&children.
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ,&pBVar25->children);
    pBVar25 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_5d0);
    LogicalType::operator=(&sql_type,&(pBVar25->super_Expression).return_type);
    if (local_5d0.binder.ptr != (Binder *)0x0) {
      (*(code *)((((local_5d0.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                  __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    AggregateFunction::~AggregateFunction(&bound_function);
    ErrorData::~ErrorData((ErrorData *)&start_type);
  }
  else {
    uVar29 = EVar2 - 0x78;
    if (0xe < uVar29) {
LAB_01294554:
      pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
      ExpressionTypeToString_abi_cxx11_((string *)&start_type,(duckdb *)(ulong)(uint)EVar2,type_00);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bound_function,"Unrecognized window expression type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &start_type);
      InternalException::InternalException(pIVar28,(string *)&bound_function);
      __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar32 = "s";
    if ((0x3bU >> (uVar29 & 0x1f) & 1) == 0) {
      if ((0x3c04U >> (uVar29 & 0x1f) & 1) == 0) {
        if (uVar29 != 0xe) goto LAB_01294554;
        params_1 = 2;
      }
      else {
        params_1 = 1;
        pcVar32 = anon_var_dwarf_3b6586a + 9;
      }
    }
    else {
      params_1 = 0;
    }
    if (((long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 != params_1) {
      pBVar21 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&bound_function,"%s needs %d parameter%s, got %d",
                 (allocator *)&best_function);
      ExpressionTypeToString_abi_cxx11_((string *)&start_type,(duckdb *)(ulong)(uint)EVar2,type);
      BinderException::BinderException<std::__cxx11::string,unsigned_long,char_const*,unsigned_long>
                (pBVar21,(string *)&bound_function,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start_type,
                 params_1,pcVar32,
                 ((long)types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       .
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __cxa_throw(pBVar21,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0xe < uVar29) {
LAB_012945b7:
      pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
      ExpressionTypeToString_abi_cxx11_((string *)&start_type,(duckdb *)(ulong)(uint)EVar2,type_01);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bound_function,"Unrecognized window expression type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &start_type);
      InternalException::InternalException(pIVar28,(string *)&bound_function);
      __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((0x7c00U >> (uVar29 & 0x1f) & 1) == 0) {
      if ((0x27U >> (uVar29 & 0x1f) & 1) == 0) {
        LVar16 = DOUBLE;
        if ((0x18U >> (uVar29 & 0x1f) & 1) == 0) goto LAB_012945b7;
      }
      else {
        LVar16 = BIGINT;
      }
      LogicalType::LogicalType(&end_type,LVar16);
    }
    else {
      other = vector<duckdb::LogicalType,_true>::get<true>(&types,0);
      LogicalType::LogicalType(&end_type,other);
    }
    LogicalType::operator=(&sql_type,&end_type);
    LogicalType::~LogicalType(&end_type);
  }
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)
       CONCAT71(bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function._1_7_,(local_5c0->super_ParsedExpression).super_BaseExpression.type);
  make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::AggregateFunction,std::default_delete<duckdb::AggregateFunction>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&local_5d0,(ExpressionType *)&bound_function,&sql_type,
             (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
              *)(local_568 + 8),
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             local_568);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::_M_move_assign(&(pBVar26->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ,&children);
  puVar6 = (local_5c0->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar30 = (local_5c0->partitions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6; puVar30 = puVar30 + 1
      ) {
    pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_5d0);
    GetExpression((duckdb *)&bound_function,puVar30);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar26->partitions,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &bound_function);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)0x0) {
      (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function + 8))();
    }
  }
  bVar3 = local_5c0->ignore_nulls;
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  pBVar26->ignore_nulls = bVar3;
  bVar3 = local_5c0->distinct;
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  pBVar26->distinct = bVar3;
  this_01 = DBConfig::GetConfig((ClientContext *)
                                ((local_5d0.context)->config).home_directory._M_string_length);
  LogicalType::LogicalType(&start_type,BIGINT);
  if (local_5c0->start == EXPR_FOLLOWING_RANGE) {
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    OVar17 = DBConfig::ResolveOrder(this_01,pvVar27->type);
    pcVar32 = "U\x04-";
    if (OVar17 == ASCENDING) {
      pcVar32 = "U\x04+";
    }
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    ::std::__cxx11::string::string
              ((string *)&bound_function,pcVar32 + 2,(allocator *)&best_function);
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    BindRangeExpression(&end_type,pCVar8,(string *)&bound_function,
                        (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)_local_588,&pvVar27->expression);
LAB_01293c2f:
    LogicalType::operator=(&start_type,&end_type);
    LogicalType::~LogicalType(&end_type);
    ::std::__cxx11::string::~string((string *)&bound_function);
  }
  else {
    if (local_5c0->start == EXPR_PRECEDING_RANGE) {
      pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
      OVar17 = DBConfig::ResolveOrder(this_01,pvVar27->type);
      pcVar32 = "U\x04-";
      if (OVar17 != ASCENDING) {
        pcVar32 = "U\x04+";
      }
      pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
      ::std::__cxx11::string::string
                ((string *)&bound_function,pcVar32 + 2,(allocator *)&best_function);
      pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
      BindRangeExpression(&end_type,pCVar8,(string *)&bound_function,
                          (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)_local_588,&pvVar27->expression);
      goto LAB_01293c2f;
    }
    OVar17 = INVALID;
  }
  LogicalType::LogicalType(&end_type,BIGINT);
  if (local_5c0->end == EXPR_FOLLOWING_RANGE) {
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    OVar17 = DBConfig::ResolveOrder(this_01,pvVar27->type);
    pcVar32 = "U\x04-";
    if (OVar17 == ASCENDING) {
      pcVar32 = "U\x04+";
    }
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    ::std::__cxx11::string::string((string *)&bound_function,pcVar32 + 2,(allocator *)&null_order);
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    BindRangeExpression((LogicalType *)&best_function,pCVar8,(string *)&bound_function,expr,
                        &pvVar27->expression);
LAB_01293d7a:
    LogicalType::operator=(&end_type,(LogicalType *)&best_function);
    LogicalType::~LogicalType((LogicalType *)&best_function);
    ::std::__cxx11::string::~string((string *)&bound_function);
  }
  else if (local_5c0->end == EXPR_PRECEDING_RANGE) {
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    OVar17 = DBConfig::ResolveOrder(this_01,pvVar27->type);
    pcVar32 = "U\x04+";
    if (OVar17 == ASCENDING) {
      pcVar32 = "U\x04-";
    }
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    ::std::__cxx11::string::string((string *)&bound_function,pcVar32 + 2,(allocator *)&null_order);
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    BindRangeExpression((LogicalType *)&best_function,pCVar8,(string *)&bound_function,expr,
                        &pvVar27->expression);
    goto LAB_01293d7a;
  }
  if (OVar17 != INVALID) {
    pvVar27 = vector<duckdb::OrderByNode,_true>::get<true>(this_00,0);
    pPVar22 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pvVar27->expression);
    puVar23 = BoundExpression::GetExpression(pPVar22);
    pEVar24 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar23);
    LogicalType::LogicalType((LogicalType *)&bound_function,&pEVar24->return_type);
    if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
        *(__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          *)_local_588 !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      LogicalType::MaxLogicalType
                ((LogicalType *)&best_function,
                 (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length,
                 (LogicalType *)&bound_function,&start_type);
      LogicalType::operator=((LogicalType *)&bound_function,(LogicalType *)&best_function);
      LogicalType::~LogicalType((LogicalType *)&best_function);
    }
    if ((expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      LogicalType::MaxLogicalType
                ((LogicalType *)&best_function,
                 (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length,
                 (LogicalType *)&bound_function,&end_type);
      LogicalType::operator=((LogicalType *)&bound_function,(LogicalType *)&best_function);
      LogicalType::~LogicalType((LogicalType *)&best_function);
    }
    pCVar8 = (ClientContext *)((local_5d0.context)->config).home_directory._M_string_length;
    local_528._M_head_impl =
         (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&best_function,pCVar8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_528,(LogicalType *)&bound_function,false);
    oVar14 = best_function;
    best_function.index = 0;
    _Var9._M_head_impl =
         (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)oVar14.index;
    if (_Var9._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
    }
    if (best_function.index != 0) {
      (**(code **)(*(long *)best_function.index + 8))();
    }
    best_function.index = 0;
    if (local_528._M_head_impl != (Expression *)0x0) {
      (*((local_528._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_528._M_head_impl = (Expression *)0x0;
    other_00 = LogicalType::operator=(&end_type,(LogicalType *)&bound_function);
    LogicalType::operator=(&start_type,other_00);
    LogicalType::~LogicalType((LogicalType *)&bound_function);
  }
  pOVar7 = (local_5c0->orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar31 = (local_5c0->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar31 != pOVar7; pOVar31 = pOVar31 + 1)
  {
    OVar17 = DBConfig::ResolveOrder(this_01,pOVar31->type);
    best_function.index._0_1_ = OVar17;
    OVar18 = DBConfig::ResolveNullOrder(this_01,OVar17,pOVar31->null_order);
    null_order = OVar18;
    GetExpression((duckdb *)&bound_function,&pOVar31->expression);
    pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_5d0);
    ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
    emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
               &pBVar26->orders,(OrderType *)&best_function,&null_order,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &bound_function);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)0x0) {
      (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function + 8))();
    }
  }
  pOVar7 = (local_5c0->arg_orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar31 = (local_5c0->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar31 != pOVar7; pOVar31 = pOVar31 + 1)
  {
    OVar17 = DBConfig::ResolveOrder(this_01,pOVar31->type);
    best_function.index._0_1_ = OVar17;
    OVar18 = DBConfig::ResolveNullOrder(this_01,OVar17,pOVar31->null_order);
    null_order = OVar18;
    GetExpression((duckdb *)&bound_function,&pOVar31->expression);
    pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_5d0);
    ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
    emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
               &pBVar26->arg_orders,(OrderType *)&best_function,&null_order,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &bound_function);
    if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
        != (_func_int **)0x0) {
      (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                    _vptr_Function + 8))();
    }
  }
  LogicalType::LogicalType((LogicalType *)&bound_function,BOOLEAN);
  CastWindowExpression((duckdb *)&best_function,puVar1,(LogicalType *)&bound_function);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  _Var9._M_head_impl =
       (pBVar26->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar26->filter_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)best_function.index;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::~LogicalType((LogicalType *)&bound_function);
  CastWindowExpression
            ((duckdb *)&bound_function,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)_local_588,&start_type);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  _Var9._M_head_impl =
       (pBVar26->start_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar26->start_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  CastWindowExpression((duckdb *)&bound_function,expr,&end_type);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  _Var9._M_head_impl =
       (pBVar26->end_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar26->end_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::LogicalType((LogicalType *)&bound_function,BIGINT);
  CastWindowExpression
            ((duckdb *)&best_function,&pWVar13->offset_expr,(LogicalType *)&bound_function);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  _Var9._M_head_impl =
       (pBVar26->offset_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar26->offset_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)best_function.index;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::~LogicalType((LogicalType *)&bound_function);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  CastWindowExpression
            ((duckdb *)&bound_function,&pWVar13->default_expr,
             &(pBVar26->super_Expression).return_type);
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  _Var9._M_head_impl =
       (pBVar26->default_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar26->default_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  WVar4 = local_5c0->start;
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  pBVar26->start = WVar4;
  WVar4 = local_5c0->end;
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  pBVar26->end = WVar4;
  WVar5 = local_5c0->exclude_clause;
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  pBVar26->exclude_clause = WVar5;
  pBVar26 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&local_5d0);
  pCVar8 = local_5d0.context;
  sVar12 = ((local_5d0.context)->config).profiler_save_location.field_2._M_allocated_capacity;
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       *(_func_int ***)(sVar12 + 0x2b0);
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p
       = (pointer)(*(long *)(sVar12 + 0x2c0) - *(long *)(sVar12 + 0x2b8) >> 3);
  make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
            ((duckdb *)&best_function,&name,&(pBVar26->super_Expression).return_type,
             (ColumnBinding *)&bound_function,&depth_local);
  bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)local_5d0.binder.ptr;
  local_5d0.binder.ptr = (Binder *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)((pCVar8->config).profiler_save_location.field_2._M_allocated_capacity + 0x2b8),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &bound_function);
  if (bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)0x0) {
    (**(code **)(*bound_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                  _vptr_Function + 8))();
  }
  local_530._M_head_impl = (Expression *)best_function.index;
  best_function.index = 0;
  BindResult::BindResult
            (__return_storage_ptr__,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_530);
  if (local_530._M_head_impl != (Expression *)0x0) {
    (*((local_530._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_530._M_head_impl = (Expression *)0x0;
  if (best_function.index != 0) {
    (**(code **)(*(long *)best_function.index + 8))();
  }
  LogicalType::~LogicalType(&end_type);
  LogicalType::~LogicalType(&start_type);
  if (local_5d0.binder.ptr != (Binder *)0x0) {
    (*(code *)((((local_5d0.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                .internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if ((FunctionData *)local_568._0_8_ != (FunctionData *)0x0) {
    (*(*(_func_int ***)local_568._0_8_)[1])();
  }
  if ((long *)local_568._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_568._8_8_ + 8))();
  }
  LogicalType::~LogicalType(&sql_type);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&children.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
LAB_01294394:
  ErrorData::~ErrorData(&error);
  ::std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

BindResult BaseSelectBinder::BindWindow(WindowExpression &window, idx_t depth) {
	QueryErrorContext error_context(window.GetQueryLocation());
	//	Check for macros pretending to be aggregates

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, window.function_name, error_context);
	auto entry = GetCatalogEntry(window.catalog, window.schema, function_lookup, OnEntryNotFound::RETURN_NULL);
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE && entry &&
	    entry->type == CatalogType::MACRO_ENTRY) {
		auto macro = make_uniq<FunctionExpression>(window.catalog, window.schema, window.function_name,
		                                           std::move(window.children), std::move(window.filter_expr), nullptr,
		                                           window.distinct);
		auto macro_expr = window.Copy();
		return BindMacro(*macro, entry->Cast<ScalarMacroCatalogEntry>(), depth, macro_expr);
	}

	auto name = window.alias;

	if (inside_window) {
		throw BinderException(error_context, "window function calls cannot be nested");
	}
	if (depth > 0) {
		throw BinderException(error_context, "correlated columns in window functions not supported");
	}

	// If we have range expressions, then only one order by clause is allowed.
	const auto is_range =
	    (window.start == WindowBoundary::EXPR_PRECEDING_RANGE || window.start == WindowBoundary::EXPR_FOLLOWING_RANGE ||
	     window.end == WindowBoundary::EXPR_PRECEDING_RANGE || window.end == WindowBoundary::EXPR_FOLLOWING_RANGE);
	if (is_range && window.orders.size() != 1) {
		throw BinderException(error_context, "RANGE frames must have only one ORDER BY expression");
	}
	// bind inside the children of the window function
	// we set the inside_window flag to true to prevent binding nested window functions
	inside_window = true;
	ErrorData error;
	for (auto &child : window.children) {
		BindChild(child, depth, error);
	}
	for (auto &child : window.partitions) {
		BindChild(child, depth, error);
	}
	for (auto &order : window.orders) {
		BindChild(order.expression, depth, error);

		//	If the frame is a RANGE frame and the type is a time,
		//	then we have to convert the time to a timestamp to avoid wrapping.
		if (!is_range || error.HasError()) {
			continue;
		}
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		const auto type_id = bound_order->return_type.id();
		if (type_id == LogicalTypeId::TIME || type_id == LogicalTypeId::TIME_TZ) {
			//	Convert to time + epoch and rebind
			unique_ptr<ParsedExpression> epoch = make_uniq<ConstantExpression>(Value::DATE(date_t::epoch()));
			BindChild(epoch, depth, error);
			BindRangeExpression(context, "+", order.expression, epoch);
		}
	}
	BindChild(window.filter_expr, depth, error);
	BindChild(window.start_expr, depth, error);
	BindChild(window.end_expr, depth, error);
	BindChild(window.offset_expr, depth, error);
	BindChild(window.default_expr, depth, error);

	for (auto &order : window.arg_orders) {
		BindChild(order.expression, depth, error);
	}

	inside_window = false;
	if (error.HasError()) {
		// failed to bind children of window function
		return BindResult(std::move(error));
	}

	//	Restore any collation expressions
	for (auto &order : window.arg_orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	for (auto &part_expr : window.partitions) {
		auto &bound_partition = BoundExpression::GetExpression(*part_expr);
		ExpressionBinder::PushCollation(context, bound_partition, bound_partition->return_type);
	}
	for (auto &order : window.orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	// successfully bound all children: create bound window function
	vector<LogicalType> types;
	vector<unique_ptr<Expression>> children;
	for (auto &child : window.children) {
		D_ASSERT(child.get());
		D_ASSERT(child->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound = BoundExpression::GetExpression(*child);
		// Add casts for positional arguments
		const auto argno = children.size();
		switch (window.GetExpressionType()) {
		case ExpressionType::WINDOW_NTILE:
			// ntile(bigint)
			if (argno == 0) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		case ExpressionType::WINDOW_NTH_VALUE:
			// nth_value(<expr>, index)
			if (argno == 1) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		default:
			break;
		}
		types.push_back(bound->return_type);
		children.push_back(std::move(bound));
	}
	//  Determine the function type.
	LogicalType sql_type;
	unique_ptr<AggregateFunction> aggregate;
	unique_ptr<FunctionData> bind_info;
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE) {
		//  Look up the aggregate function in the catalog
		if (!entry || entry->type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			//	Not an aggregate: Look it up to generate error
			Catalog::GetEntry<AggregateFunctionCatalogEntry>(context, window.catalog, window.schema,
			                                                 window.function_name, error_context);
		}
		auto &func = entry->Cast<AggregateFunctionCatalogEntry>();
		D_ASSERT(func.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);

		// bind the aggregate
		ErrorData error_aggr;
		FunctionBinder function_binder(context);
		auto best_function = function_binder.BindFunction(func.name, func.functions, types, error_aggr);
		if (!best_function.IsValid()) {
			error_aggr.AddQueryLocation(window);
			error_aggr.Throw();
		}

		// found a matching function! bind it as an aggregate
		auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());
		auto window_bound_aggregate = function_binder.BindAggregateFunction(bound_function, std::move(children));
		// create the aggregate
		aggregate = make_uniq<AggregateFunction>(window_bound_aggregate->function);
		bind_info = std::move(window_bound_aggregate->bind_info);
		children = std::move(window_bound_aggregate->children);
		sql_type = window_bound_aggregate->return_type;

	} else {
		// fetch the child of the non-aggregate window function (if any)
		sql_type = ResolveWindowExpressionType(window.GetExpressionType(), types);
	}
	auto result = make_uniq<BoundWindowExpression>(window.GetExpressionType(), sql_type, std::move(aggregate),
	                                               std::move(bind_info));
	result->children = std::move(children);
	for (auto &child : window.partitions) {
		result->partitions.push_back(GetExpression(child));
	}
	result->ignore_nulls = window.ignore_nulls;
	result->distinct = window.distinct;

	// Convert RANGE boundary expressions to ORDER +/- expressions.
	// Note that PRECEEDING and FOLLOWING refer to the sequential order in the frame,
	// not the natural ordering of the type. This means that the offset arithmetic must be reversed
	// for ORDER BY DESC.
	auto &config = DBConfig::GetConfig(context);
	auto range_sense = OrderType::INVALID;
	LogicalType start_type = LogicalType::BIGINT;
	if (window.start == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);

	} else if (window.start == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);
	}

	LogicalType end_type = LogicalType::BIGINT;
	if (window.end == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);

	} else if (window.end == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);
	}

	// Cast ORDER and boundary expressions to the same type
	if (range_sense != OrderType::INVALID) {
		D_ASSERT(window.orders.size() == 1);

		auto &order_expr = window.orders[0].expression;
		D_ASSERT(order_expr.get());
		D_ASSERT(order_expr->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		auto order_type = bound_order->return_type;
		if (window.start_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, start_type);
		}
		if (window.end_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, end_type);
		}

		// Cast all three to match
		bound_order = BoundCastExpression::AddCastToType(context, std::move(bound_order), order_type);
		start_type = end_type = order_type;
	}

	for (auto &order : window.orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->orders.emplace_back(type, null_order, std::move(expression));
	}

	// Argument orders are just like arguments, not frames
	for (auto &order : window.arg_orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->arg_orders.emplace_back(type, null_order, std::move(expression));
	}

	result->filter_expr = CastWindowExpression(window.filter_expr, LogicalType::BOOLEAN);
	result->start_expr = CastWindowExpression(window.start_expr, start_type);
	result->end_expr = CastWindowExpression(window.end_expr, end_type);
	result->offset_expr = CastWindowExpression(window.offset_expr, LogicalType::BIGINT);
	result->default_expr = CastWindowExpression(window.default_expr, result->return_type);
	result->start = window.start;
	result->end = window.end;
	result->exclude_clause = window.exclude_clause;

	// create a BoundColumnRef that references this entry
	auto colref = make_uniq<BoundColumnRefExpression>(std::move(name), result->return_type,
	                                                  ColumnBinding(node.window_index, node.windows.size()), depth);
	// move the WINDOW expression into the set of bound windows
	node.windows.push_back(std::move(result));
	return BindResult(std::move(colref));
}